

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>
helics::make_filter(FilterTypes type,Core *core,string_view name)

{
  Filter *pFVar1;
  char *pcVar2;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *dfilt;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true> _Var3;
  char *in_R8;
  string_view filtName;
  string_view filtName_00;
  Core *extraout_RDX;
  Core *extraout_RDX_00;
  
  _Var3.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
  super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
  super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var3.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
  super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
  super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl._0_4_ = type;
  pcVar2 = name._M_str;
  if ((FilterTypes)core == CLONE) {
    pFVar1 = (Filter *)operator_new(0x50);
    filtName._M_str = in_R8;
    filtName._M_len = (size_t)pcVar2;
    CloningFilter::CloningFilter((CloningFilter *)pFVar1,(Core *)name._M_len,filtName);
    *(Filter **)
     _Var3.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
     super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
     super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = pFVar1;
    addOperations(pFVar1,CLONE,extraout_RDX);
    (*(pFVar1->super_Interface)._vptr_Interface[6])(pFVar1,8,"delivery",pcVar2);
  }
  else {
    pFVar1 = (Filter *)operator_new(0x50);
    filtName_00._M_str = in_R8;
    filtName_00._M_len = (size_t)pcVar2;
    Filter::Filter(pFVar1,(Core *)name._M_len,filtName_00);
    *(Filter **)
     _Var3.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
     super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
     super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = pFVar1;
    addOperations(pFVar1,(FilterTypes)core,extraout_RDX_00);
  }
  return (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         (tuple<helics::Filter_*,_std::default_delete<helics::Filter>_>)
         _Var3.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Filter> make_filter(FilterTypes type, Core* core, std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        std::unique_ptr<Filter> dfilt = std::make_unique<CloningFilter>(core, name);
        addOperations(dfilt.get(), type, core);
        dfilt->setString("delivery", name);
        return dfilt;
    }
    auto dfilt = std::make_unique<Filter>(core, name);
    addOperations(dfilt.get(), type, core);
    return dfilt;
}